

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_estimator_impl.cc
# Opt level: O2

void __thiscall
webrtc::LevelEstimatorImpl::LevelEstimatorImpl(LevelEstimatorImpl *this,CriticalSection *crit)

{
  RMSLevel *this_00;
  ostream *poVar1;
  FatalMessage local_190;
  
  (this->super_LevelEstimator)._vptr_LevelEstimator = (_func_int **)&PTR_Enable_001d4920;
  this->crit_ = crit;
  this->enabled_ = false;
  this_00 = (RMSLevel *)operator_new(0x10);
  RMSLevel::RMSLevel(this_00);
  (this->rms_)._M_t.super___uniq_ptr_impl<webrtc::RMSLevel,_std::default_delete<webrtc::RMSLevel>_>.
  _M_t.super__Tuple_impl<0UL,_webrtc::RMSLevel_*,_std::default_delete<webrtc::RMSLevel>_>.
  super__Head_base<0UL,_webrtc::RMSLevel_*,_false>._M_head_impl = this_00;
  if (crit != (CriticalSection *)0x0) {
    return;
  }
  rtc::FatalMessage::FatalMessage
            (&local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/level_estimator_impl.cc"
             ,0x15);
  poVar1 = std::operator<<((ostream *)&local_190,"Check failed: crit");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<(poVar1,"# ");
  rtc::FatalMessage::~FatalMessage(&local_190);
}

Assistant:

LevelEstimatorImpl::LevelEstimatorImpl(rtc::CriticalSection* crit)
    : crit_(crit), rms_(new RMSLevel()) {
  RTC_DCHECK(crit);
}